

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::GenerateMergeFromCodedStream
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "DO_(::google::protobuf::internal::WireFormatLite::ReadGroupNoVirtual(\n      $number$, input, add_$name$()));\n"
  ;
  if (*(int *)(this->descriptor_ + 0x2c) == 0xb) {
    text = 
    "DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(\n      input, add_$name$()));\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  if (descriptor_->type() == FieldDescriptor::TYPE_MESSAGE) {
    printer->Print(variables_,
      "DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(\n"
      "      input, add_$name$()));\n");
  } else {
    printer->Print(variables_,
      "DO_(::google::protobuf::internal::WireFormatLite::ReadGroupNoVirtual(\n"
      "      $number$, input, add_$name$()));\n");
  }
}